

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::LiteBasicTest_AllLite20_Test::~LiteBasicTest_AllLite20_Test
          (LiteBasicTest_AllLite20_Test *this)

{
  LiteBasicTest_AllLite20_Test *this_local;
  
  ~LiteBasicTest_AllLite20_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(LiteBasicTest, AllLite20) {
  {
    // CopyFromMessageMap
    proto2_unittest::TestMessageMapLite message1, message2;

    (*message1.mutable_map_int32_message())[0].add_repeated_int32(100);
    (*message2.mutable_map_int32_message())[0].add_repeated_int32(101);

    message1.CopyFrom(message2);  // NOLINT

    // Checks repeated field is overwritten.
    EXPECT_EQ(1, message1.map_int32_message().at(0).repeated_int32_size());
    EXPECT_EQ(101, message1.map_int32_message().at(0).repeated_int32(0));
  }
}